

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

void __thiscall chrono::fea::ChElementTetraCorot_10::UpdateRotation(ChElementTetraCorot_10 *this)

{
  undefined1 auVar1 [16];
  pointer psVar2;
  element_type *peVar3;
  ChMatrixNM<double,_4,_4> *pCVar4;
  undefined8 in_RDX;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ChMatrixNM<double,_4,_4> *pCVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  ChMatrixNM<double,_4,_4> P;
  ChMatrix33<double> F;
  ChMatrix33<double> S;
  undefined8 local_180 [19];
  double local_e8 [9];
  double local_a0 [18];
  
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = 0;
  uVar10 = CONCAT71((int7)((ulong)in_RDX >> 8),7) & 0xffffffff;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  auVar11._8_8_ = (ulong)((byte)(uVar10 >> 1) & 1) * *(long *)&peVar3->field_0x28;
  auVar11._0_8_ = (ulong)((byte)uVar10 & 1) * *(long *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  auVar11._16_8_ = (ulong)((byte)(uVar10 >> 2) & 1) * *(long *)&peVar3->field_0x30;
  auVar11._24_8_ = 0;
  vscatterqpd_avx512vl(ZEXT832(local_180) + _DAT_009840e0,uVar10,auVar11);
  peVar3 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4 + 8) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x20);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x18);
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar5 = 4;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x1c);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1c);
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar5 = 6;
  do {
    *(undefined8 *)((long)local_180 + lVar5 * 4) =
         *(undefined8 *)((long)&peVar3->super_ChNodeFEAbase + lVar5 + 0x1a);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x1e);
  pCVar4 = &this->mM;
  uVar10 = 0;
  local_180[0xc] = 0x3ff0000000000000;
  local_180[0xd] = 0x3ff0000000000000;
  local_180[0xe] = 0x3ff0000000000000;
  local_180[0xf] = 0x3ff0000000000000;
  do {
    puVar6 = local_180;
    uVar7 = 0;
    do {
      auVar14 = ZEXT864(0) << 0x40;
      uVar9 = 0;
      pCVar8 = pCVar4;
      do {
        if ((3 < (uVar9 | uVar7)) || (3 < (uVar9 | uVar10))) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 4, 4, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 4, 4, 1>, Level = 1]"
                       );
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)puVar6 + uVar9 * 8);
        uVar9 = uVar9 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).
                       m_storage.m_data.array[0];
        auVar1 = vfmadd231sd_fma(auVar14._0_16_,auVar15,auVar1);
        auVar14 = ZEXT1664(auVar1);
        pCVar8 = (ChMatrixNM<double,_4,_4> *)
                 ((pCVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).m_storage.
                  m_data.array + 4);
      } while (uVar9 != 4);
      uVar9 = uVar7 + 1;
      puVar6 = (undefined8 *)((long)puVar6 + 0x20);
      local_e8[uVar10 + uVar7 * 3] = auVar1._0_8_;
      uVar7 = uVar9;
    } while (uVar9 != 3);
    uVar10 = uVar10 + 1;
    pCVar4 = (ChMatrixNM<double,_4,_4> *)
             ((pCVar4->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).m_storage.
              m_data.array + 1);
    if (uVar10 == 3) {
      dVar12 = PolarDecomposition::Compute
                         (local_e8,(double *)&(this->super_ChElementCorotational).A,local_a0,1e-06);
      if (dVar12 < 0.0) {
        dVar12 = *(double *)
                  ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 8);
        (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
             -(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
        ;
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 8) = -dVar12;
        dVar12 = *(double *)
                  ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x18);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x10) = -*(double *)
                     ((long)(this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x10);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x18) = -dVar12;
        dVar12 = *(double *)
                  ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x28);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x20) = -*(double *)
                     ((long)(this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x20);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x28) = -dVar12;
        dVar12 = *(double *)
                  ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x38);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x30) = -*(double *)
                     ((long)(this->super_ChElementCorotational).A.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array + 0x30);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x38) = -dVar12;
        auVar13._0_8_ =
             -*(double *)
               ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x40);
        auVar13._8_8_ = 0x8000000000000000;
        dVar12 = (double)vmovlpd_avx(auVar13);
        *(double *)
         ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
         + 0x40) = dVar12;
      }
      return;
    }
  } while( true );
}

Assistant:

void ChElementTetraCorot_10::UpdateRotation() {
    // P = [ p_0  p_1  p_2  p_3 ]
    //     [ 1    1    1    1   ]
    ChMatrixNM<double, 4, 4> P;
    P.block(0, 0, 3, 1) = nodes[0]->pos.eigen();
    P.block(0, 1, 3, 1) = nodes[1]->pos.eigen();
    P.block(0, 2, 3, 1) = nodes[2]->pos.eigen();
    P.block(0, 3, 3, 1) = nodes[3]->pos.eigen();
    P(3, 0) = 1.0;
    P(3, 1) = 1.0;
    P(3, 2) = 1.0;
    P(3, 3) = 1.0;

    ChMatrix33<double> F;
    // F=P*mM (only upper-left 3x3 block!)
    double sum;
    for (int colres = 0; colres < 3; ++colres)
        for (int row = 0; row < 3; ++row) {
            sum = 0;
            for (int col = 0; col < 4; ++col)
                sum += (P(row, col)) * (mM(col, colres));
            F(row, colres) = sum;
        }
    ChMatrix33<> S;
    double det = ChPolarDecomposition<>::Compute(F, this->A, S, 1E-6);
    if (det < 0)
        this->A *= -1.0;

    // GetLog() << "FEM rotation: \n" << A << "\n"
}